

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoint_comps(dxt1_endpoint_optimizer *this)

{
  dxt1_endpoint_optimizer *pdVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  sbyte sVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  color_quad_u8 high;
  color_quad_u8 low;
  color_quad_u8 source_high;
  color_quad_u8 source_low;
  uint64 best_remaining_error [4];
  uint64 error [4] [256];
  undefined1 local_20ac [10];
  uint16 local_20a2;
  long local_20a0;
  dxt1_solution_coordinates local_2094;
  dxt1_endpoint_optimizer *local_2090;
  undefined4 local_2084;
  undefined1 local_2080 [8];
  uint64 local_2078;
  ulong local_2070;
  ulong local_2068;
  ulong local_2060;
  ulong local_2058;
  uint64 local_2050;
  uint64 local_2048;
  uint64 local_2040;
  uint64 local_2038 [256];
  long alStack_1838 [512];
  long alStack_838 [257];
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  if (((this->m_best_solution).m_alpha_block == false) && ((this->m_best_solution).m_error != 0)) {
    dxt1_block::unpack_color
              ((dxt1_block *)(local_2080 + 4),(this->m_best_solution).m_coords.m_low_color,true,0xff
              );
    dxt1_block::unpack_color
              ((dxt1_block *)local_2080,(this->m_best_solution).m_coords.m_high_color,true,0xff);
    lVar10 = 0;
    local_2090 = this;
    do {
      pdVar1 = local_2090;
      bVar11 = local_2080[lVar10 + 4];
      bVar2 = local_2080[lVar10];
      dxt1_block::unpack_color
                ((dxt1_block *)(local_20ac + 4),(local_2090->m_best_solution).m_coords.m_low_color,
                 false,0xff);
      dxt1_block::unpack_color
                ((dxt1_block *)local_20ac,(pdVar1->m_best_solution).m_coords.m_high_color,false,0xff
                );
      compute_endpoint_component_errors
                (pdVar1,(uint)lVar10,(uint64 (*) [4] [256])local_2038,(uint64 (*) [4])&local_2058);
      local_20a0 = lVar10;
      uVar9 = alStack_1838[(byte)local_20ac[lVar10]] +
              alStack_1838[(ulong)(byte)local_20ac[lVar10 + 4] - 0x100] +
              alStack_838[(ulong)(((uint)bVar2 + (uint)bVar11 * 2) / 3) - 0x100] +
              alStack_838[((uint)bVar11 + (uint)bVar2 * 2) / 3];
      if (local_2058 < uVar9) {
        bVar14 = lVar10 == 1;
        bVar11 = bVar14 * ' ' + 0x20;
        local_2078 = local_2050;
        sVar8 = bVar14 * '\x02' + 2;
        uVar6 = 0;
        do {
          bVar2 = (byte)uVar6;
          local_2068 = uVar6 & 0xff;
          lVar10 = alStack_1838[(uVar6 & 0xff) - 0x100];
          local_2084 = (int)uVar6;
          if (local_2078 + lVar10 < uVar9) {
            local_20ac[local_20a0 + 4] = bVar2;
            local_20a2 = dxt1_block::pack_color((color_quad_u8 *)(local_20ac + 4),false,0x7f);
            bVar2 = bVar2 >> sVar8 | bVar2 << (bVar14 ^ 3U);
            local_2060 = (ulong)bVar2;
            uVar6 = (ulong)((uint)bVar2 * 2);
            lVar5 = 0;
            local_2070 = uVar6;
            do {
              if (local_2048 + alStack_1838[lVar5] + lVar10 < uVar9) {
                bVar2 = (byte)lVar5;
                bVar7 = bVar2 >> sVar8 | bVar2 << (bVar14 ^ 3U);
                uVar12 = (ulong)(((int)uVar6 + (uint)bVar7) * 0x5556 >> 0x10);
                lVar4 = alStack_1838[lVar5] + lVar10 + alStack_838[uVar12 - 0x100];
                if ((local_2040 + lVar4 < uVar9) &&
                   (uVar13 = ((int)local_2060 + (uint)bVar7 * 2) * 0x5556 >> 0x10,
                   (ulong)(lVar4 + alStack_838[uVar13]) < uVar9)) {
                  local_20ac[local_20a0] = bVar2;
                  local_2094.m_high_color =
                       dxt1_block::pack_color((color_quad_u8 *)local_20ac,false,0x7f);
                  local_2094.m_low_color = local_20a2;
                  bVar3 = evaluate_solution(local_2090,&local_2094,false);
                  pdVar1 = local_2090;
                  uVar6 = local_2070;
                  if (bVar3) {
                    if ((local_2090->m_best_solution).m_error == 0) {
                      return;
                    }
                    if (local_2090->m_evaluate_hc == true) {
                      compute_selectors_hc(local_2090);
                    }
                    compute_endpoint_component_errors
                              (pdVar1,(uint)local_20a0,(uint64 (*) [4] [256])local_2038,
                               (uint64 (*) [4])&local_2058);
                    lVar10 = alStack_1838[local_2068 - 0x100];
                    uVar9 = alStack_1838[lVar5] + lVar10 + alStack_838[uVar12 - 0x100] +
                            alStack_838[uVar13];
                    local_2078 = local_2050;
                    uVar6 = local_2070;
                    if (uVar9 <= local_2050 + lVar10) break;
                  }
                }
              }
              lVar5 = lVar5 + 1;
            } while ((byte)lVar5 < bVar11);
          }
          bVar2 = (char)local_2084 + 1;
          uVar6 = (ulong)CONCAT31((int3)((uint)local_2084 >> 8),bVar2);
        } while (bVar2 < bVar11);
      }
      lVar10 = local_20a0 + 1;
    } while (lVar10 != 3);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoint_comps()
    {
        compute_selectors();
        if (m_best_solution.m_alpha_block || !m_best_solution.m_error)
        {
            return;
        }
        color_quad_u8 source_low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true));
        color_quad_u8 source_high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true));
        uint64 error[4][256], best_remaining_error[4];
        for (uint comp_index = 0; comp_index < 3; comp_index++)
        {
            uint8 p0 = source_low[comp_index];
            uint8 p1 = source_high[comp_index];
            color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
            color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
            compute_endpoint_component_errors(comp_index, error, best_remaining_error);
            uint64 best_error = error[0][low[comp_index]] + error[1][high[comp_index]] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
            if (best_remaining_error[0] >= best_error)
            {
                continue;
            }
            const uint comp_limit = comp_index == 1 ? 64 : 32;
            for (uint8 c0 = 0; c0 < comp_limit; c0++)
            {
                uint64 e0 = error[0][c0];
                if (e0 + best_remaining_error[1] >= best_error)
                {
                    continue;
                }
                low[comp_index] = c0;
                uint16 packed_low = dxt1_block::pack_color(low, false);
                p0 = comp_index == 1 ? c0 << 2 | c0 >> 4 : c0 << 3 | c0 >> 2;
                for (uint8 c1 = 0; c1 < comp_limit; c1++)
                {
                    uint64 e = e0 + error[1][c1];
                    if (e + best_remaining_error[2] >= best_error)
                    {
                        continue;
                    }
                    p1 = comp_index == 1 ? c1 << 2 | c1 >> 4 : c1 << 3 | c1 >> 2;
                    e += error[2][(p0 * 2 + p1) / 3];
                    if (e + best_remaining_error[3] >= best_error)
                    {
                        continue;
                    }
                    e += error[3][(p0 + p1 * 2) / 3];
                    if (e >= best_error)
                    {
                        continue;
                    }
                    high[comp_index] = c1;
                    if (!evaluate_solution(dxt1_solution_coordinates(packed_low, dxt1_block::pack_color(high, false))))
                    {
                        continue;
                    }
                    if (!m_best_solution.m_error)
                    {
                        return;
                    }
                    compute_selectors();
                    compute_endpoint_component_errors(comp_index, error, best_remaining_error);
                    best_error = error[0][c0] + error[1][c1] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
                    e0 = error[0][c0];
                    if (e0 + best_remaining_error[1] >= best_error)
                    {
                        break;
                    }
                }
            }
        }
    }